

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_tweak_add(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *tweak)

{
  int iVar1;
  long in_RDX;
  void *in_RSI;
  secp256k1_ecmult_context *in_RDI;
  secp256k1_ge *unaff_retaddr;
  int overflow;
  int ret;
  secp256k1_scalar term;
  secp256k1_ge p;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  bool bVar2;
  int iVar3;
  undefined4 uVar4;
  uchar *in_stack_ffffffffffffff68;
  secp256k1_scalar *in_stack_ffffffffffffff70;
  secp256k1_ge *in_stack_ffffffffffffff98;
  secp256k1_ge *in_stack_ffffffffffffffa0;
  secp256k1_context *in_stack_ffffffffffffffa8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar5;
  
  uVar4 = 0;
  iVar3 = 0;
  iVar1 = secp256k1_ecmult_context_is_built(in_RDI);
  if (iVar1 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(uVar4,iVar3),
               (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    uVar5 = 0;
  }
  else if (in_RSI == (void *)0x0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(uVar4,iVar3),
               (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    uVar5 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)CONCAT44(uVar4,iVar3),
               (char *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    uVar5 = 0;
  }
  else {
    secp256k1_scalar_set_b32
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(int *)CONCAT44(uVar4,iVar3));
    bVar2 = false;
    if (iVar3 == 0) {
      iVar1 = secp256k1_pubkey_load
                        (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                         (secp256k1_pubkey *)in_stack_ffffffffffffff98);
      bVar2 = iVar1 != 0;
    }
    uVar5 = (uint)bVar2;
    memset(in_RSI,0,0x40);
    if (uVar5 != 0) {
      iVar1 = secp256k1_eckey_pubkey_tweak_add
                        (_overflow,unaff_retaddr,
                         (secp256k1_scalar *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      if (iVar1 == 0) {
        uVar5 = 0;
      }
      else {
        secp256k1_pubkey_save
                  ((secp256k1_pubkey *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
    }
  }
  return uVar5;
}

Assistant:

int secp256k1_ec_pubkey_tweak_add(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *tweak) {
    secp256k1_ge p;
    secp256k1_scalar term;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(pubkey != NULL);
    ARG_CHECK(tweak != NULL);

    secp256k1_scalar_set_b32(&term, tweak, &overflow);
    ret = !overflow && secp256k1_pubkey_load(ctx, &p, pubkey);
    memset(pubkey, 0, sizeof(*pubkey));
    if (ret) {
        if (secp256k1_eckey_pubkey_tweak_add(&ctx->ecmult_ctx, &p, &term)) {
            secp256k1_pubkey_save(pubkey, &p);
        } else {
            ret = 0;
        }
    }

    return ret;
}